

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O3

exr_result_t
exr_attr_opaquedata_copy(exr_context_t ctxt,exr_attr_opaquedata_t *ud,exr_attr_opaquedata_t *srcud)

{
  int iVar1;
  void *__src;
  int iVar2;
  exr_result_t eVar3;
  
  if (srcud == (exr_attr_opaquedata_t *)0x0) {
    iVar2 = 3;
  }
  else {
    __src = srcud->packed_data;
    if (__src == (void *)0x0) {
      if (ctxt != (exr_context_t)0x0) {
        if (ud == (exr_attr_opaquedata_t *)0x0) {
          iVar2 = (**(code **)(ctxt + 0x40))
                            (ctxt,3,"Invalid reference to opaque data object to initialize");
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        else {
          ud->unpack_func_ptr =
               (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
          ud->pack_func_ptr =
               (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
          ud->packed_data = (void *)0x0;
          ud->unpacked_data = (void *)0x0;
          ud->size = 0;
          ud->unpacked_size = 0;
          ud->packed_alloc_size = 0;
          ud->pad[0] = '\0';
          ud->pad[1] = '\0';
          ud->pad[2] = '\0';
          ud->pad[3] = '\0';
          ud->destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
        }
        eVar3 = exr_attr_opaquedata_set_unpacked(ctxt,ud,srcud->unpacked_data,srcud->unpacked_size);
        return eVar3;
      }
      iVar2 = 2;
    }
    else {
      iVar1 = srcud->size;
      iVar2 = exr_attr_opaquedata_init(ctxt,ud,(long)iVar1);
      if (iVar2 == 0) {
        iVar2 = 0;
        if (ud->packed_data != (void *)0x0) {
          memcpy(ud->packed_data,__src,(long)iVar1);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

exr_result_t
exr_attr_opaquedata_copy (
    exr_context_t                ctxt,
    exr_attr_opaquedata_t*       ud,
    const exr_attr_opaquedata_t* srcud)
{
    exr_result_t rv;
    if (!srcud) return EXR_ERR_INVALID_ARGUMENT;
    if (srcud->packed_data)
        return exr_attr_opaquedata_create (
            ctxt, ud, (size_t) srcud->size, srcud->packed_data);
    rv = exr_attr_opaquedata_init (ctxt, ud, 0);
    if (rv == EXR_ERR_SUCCESS)
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, ud, srcud->unpacked_data, srcud->unpacked_size);
    return rv;
}